

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O1

X509_NAME_ENTRY *
X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,ASN1_OBJECT *obj,int type,uchar *bytes,int len)

{
  int iVar1;
  X509_NAME_ENTRY *ne_00;
  
  if (((ne != (X509_NAME_ENTRY **)0x0) && (ne_00 = *ne, ne_00 != (X509_NAME_ENTRY *)0x0)) ||
     (ne_00 = X509_NAME_ENTRY_new(), ne_00 != (X509_NAME_ENTRY *)0x0)) {
    iVar1 = X509_NAME_ENTRY_set_object(ne_00,obj);
    if ((iVar1 != 0) && (iVar1 = X509_NAME_ENTRY_set_data(ne_00,type,bytes,len), iVar1 != 0)) {
      if (ne == (X509_NAME_ENTRY **)0x0) {
        return ne_00;
      }
      if (*ne != (X509_NAME_ENTRY *)0x0) {
        return ne_00;
      }
      *ne = ne_00;
      return ne_00;
    }
    if ((ne == (X509_NAME_ENTRY **)0x0) || (ne_00 != *ne)) {
      X509_NAME_ENTRY_free(ne_00);
    }
  }
  return (X509_NAME_ENTRY *)0x0;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,
                                               const ASN1_OBJECT *obj, int type,
                                               const unsigned char *bytes,
                                               ossl_ssize_t len) {
  X509_NAME_ENTRY *ret;

  if ((ne == NULL) || (*ne == NULL)) {
    if ((ret = X509_NAME_ENTRY_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *ne;
  }

  if (!X509_NAME_ENTRY_set_object(ret, obj)) {
    goto err;
  }
  if (!X509_NAME_ENTRY_set_data(ret, type, bytes, len)) {
    goto err;
  }

  if ((ne != NULL) && (*ne == NULL)) {
    *ne = ret;
  }
  return ret;
err:
  if ((ne == NULL) || (ret != *ne)) {
    X509_NAME_ENTRY_free(ret);
  }
  return NULL;
}